

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZOneShapeRestraint.h
# Opt level: O3

void __thiscall TPZOneShapeRestraint::Write(TPZOneShapeRestraint *this,TPZStream *buf)

{
  pair<long,_int> *ppVar1;
  long lVar2;
  TPZManVector<int,_4> faces;
  TPZManVector<long,_4> seqnums;
  TPZVec<int> local_90;
  int local_70 [4];
  TPZVec<long> local_60;
  long local_40 [4];
  
  TPZVec<long>::TPZVec(&local_60,0);
  local_60._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01878bc8;
  local_60.fNElements = 4;
  local_60.fNAlloc = 0;
  local_60.fStore = local_40;
  TPZVec<int>::TPZVec(&local_90,0);
  local_90._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018bdaf8;
  local_90.fNElements = 4;
  local_90.fNAlloc = 0;
  ppVar1 = (this->fFaces).super_TPZVec<std::pair<long,_int>_>.fStore;
  lVar2 = 0x10;
  do {
    *(long *)((long)local_60.fStore + lVar2 * 4 + -0x40) = (&ppVar1[-8].first)[lVar2];
    *(undefined4 *)((long)&local_90._vptr_TPZVec + lVar2 * 2) =
         *(undefined4 *)((long)ppVar1 + lVar2 * 8 + -0x78);
    lVar2 = lVar2 + 2;
  } while (lVar2 != 0x18);
  local_90.fStore = local_70;
  (*buf->_vptr_TPZStream[5])(buf,local_60.fStore,4);
  (*buf->_vptr_TPZStream[3])(buf,local_90.fStore,4);
  (*buf->_vptr_TPZStream[3])(buf,(this->fOrient).super_TPZVec<int>.fStore,4);
  if (local_90.fStore != local_70) {
    local_90.fNAlloc = 0;
    local_90._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_90.fStore != (int *)0x0) {
      operator_delete__(local_90.fStore);
    }
  }
  if (local_60.fStore != local_40) {
    local_60.fNAlloc = 0;
    local_60._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
    if (local_60.fStore != (long *)0x0) {
      operator_delete__(local_60.fStore);
    }
  }
  return;
}

Assistant:

void Write(TPZStream &buf) const
    {
        TPZManVector<int64_t,4> seqnums(4);
        TPZManVector<int,4> faces(4);
        for (int i=0; i<4; i++)
        {
            seqnums[i] = fFaces[i].first;
            faces[i] = fFaces[i].second;
        }
        buf.Write(&seqnums[0],4);
        buf.Write(&faces[0],4);
        buf.Write(&fOrient[0],4);
    }